

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O1

void __thiscall ReconnectingHub::connectToTarget(ReconnectingHub *this)

{
  Dashel::Hub::connect((string *)this);
  return;
}

Assistant:

void connectToTarget()
	{
		try
		{
			connect(target);
		}
		catch (const DashelException& e)
		{
			cout << endl
				 << "Failed connecting to " << target << " : " << e.what() << endl;
		}
	}